

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiftMotor.h
# Opt level: O3

void __thiscall LiftMotor::LiftMotor(LiftMotor *this,ofstream *myFile)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  
  this->zmin = 0;
  this->zmax = 10000;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"LIFT MOTOR INITIALIZED!",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)myFile + -0x18) + (char)myFile);
  std::ostream::put((char)myFile);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"LIFT MOTOR INITIALIZED!",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar1 = rand();
  this->z = iVar1 % this->zmax;
  this->LimitSwitchBottom = false;
  this->LimitSwitchTop = false;
  return;
}

Assistant:

LiftMotor::LiftMotor(ofstream &myFile)
{
	srand(time(NULL));
	cout << endl << "LIFT MOTOR INITIALIZED!" << endl;
	myFile << endl << "LIFT MOTOR INITIALIZED!" << endl;
	z = rand() % zmax;
	LimitSwitchTop = false;
	LimitSwitchBottom = false;
}